

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_snap.c
# Opt level: O0

void lj_snap_add(jit_State *J)

{
  ushort uVar1;
  MSize local_38;
  uint local_34;
  MSize nsnapmap;
  MSize nsnap;
  jit_State *J_local;
  
  uVar1 = (J->cur).nsnap;
  local_34 = (uint)uVar1;
  local_38 = (J->cur).nsnapmap;
  if (((local_34 != 0) && ((uint)(J->cur).snap[local_34 - 1].ref == (J->cur).nins)) ||
     ((J->mergesnap != '\0' && (((J->guardemit).irt & 0x80) == 0)))) {
    if (local_34 != 1) {
      local_34 = local_34 - 1;
      local_38 = (J->cur).snap[local_34].mapofs;
      goto LAB_0019f513;
    }
    (J->fold).ins.field_0.ot = 0xc00;
    (J->fold).ins.field_0.op1 = 0;
    (J->fold).ins.field_0.op2 = 0;
    lj_ir_emit(J);
  }
  if (J->sizesnap < local_34 + 1) {
    lj_snap_grow_buf_(J,local_34 + 1);
  }
  (J->cur).nsnap = uVar1 + 1;
LAB_0019f513:
  J->mergesnap = '\0';
  (J->guardemit).irt = '\0';
  snapshot_stack(J,(J->cur).snap + local_34,local_38);
  return;
}

Assistant:

void lj_snap_add(jit_State *J)
{
  MSize nsnap = J->cur.nsnap;
  MSize nsnapmap = J->cur.nsnapmap;
  /* Merge if no ins. inbetween or if requested and no guard inbetween. */
  if ((nsnap > 0 && J->cur.snap[nsnap-1].ref == J->cur.nins) ||
      (J->mergesnap && !irt_isguard(J->guardemit))) {
    if (nsnap == 1) {  /* But preserve snap #0 PC. */
      emitir_raw(IRT(IR_NOP, IRT_NIL), 0, 0);
      goto nomerge;
    }
    nsnapmap = J->cur.snap[--nsnap].mapofs;
  } else {
  nomerge:
    lj_snap_grow_buf(J, nsnap+1);
    J->cur.nsnap = (uint16_t)(nsnap+1);
  }
  J->mergesnap = 0;
  J->guardemit.irt = 0;
  snapshot_stack(J, &J->cur.snap[nsnap], nsnapmap);
}